

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall
chrono::ChBody::ComputeJacobianForRollingContactPart
          (ChBody *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  undefined1 local_100 [56];
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_c8;
  ChRowVectorRef local_98;
  ChMatrix33<double> Jr1;
  
  local_100._8_8_ =
       &(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix;
  local_100._0_8_ = contact_plane;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jr1,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_100);
  if (!second) {
    local_100._0_8_ = &DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&Jr1,(Scalar *)local_100);
  }
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            ((ChRowVectorRef *)&local_c8,jacobian_tuple_N);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_100,
              (Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_> *)&local_c8,0,
              3);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1,_-1,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>_>
             *)local_100);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            ((ChRowVectorRef *)&local_c8,jacobian_tuple_U);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_100,
              (Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_> *)&local_c8,0,
              3);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1,_-1,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>_>
             *)local_100);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            ((ChRowVectorRef *)&local_c8,jacobian_tuple_V);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_100,
              (Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_> *)&local_c8,0,
              3);
  Eigen::
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1,_-1,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>_>
             *)local_100);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_c8,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_98,jacobian_tuple_N);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_100,&local_98,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_100,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_c8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_c8,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_98,jacobian_tuple_U);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_100,&local_98,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_100,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_c8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_c8,&Jr1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::Get_Cq
            (&local_98,jacobian_tuple_V);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_100,&local_98,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
              *)local_100,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_c8);
  return;
}

Assistant:

void ChBody::ComputeJacobianForRollingContactPart(
    const ChVector<>& abs_point,
    ChMatrix33<>& contact_plane,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_N,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_U,
    ChVariableTupleCarrier_1vars<6>::type_constraint_tuple& jacobian_tuple_V,
    bool second) {
    ChMatrix33<> Jr1 = contact_plane.transpose() * this->GetA();
    if (!second)
        Jr1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3).setZero();
    jacobian_tuple_U.Get_Cq().segment(0, 3).setZero();
    jacobian_tuple_V.Get_Cq().segment(0, 3).setZero();
    jacobian_tuple_N.Get_Cq().segment(3, 3) = Jr1.row(0);
    jacobian_tuple_U.Get_Cq().segment(3, 3) = Jr1.row(1);
    jacobian_tuple_V.Get_Cq().segment(3, 3) = Jr1.row(2);
}